

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

void * map_remove(Map *map,void *key)

{
  List *list;
  long *__ptr;
  int i;
  uint index;
  void *pvVar1;
  
  pvVar1 = (void *)0x0;
  list = (List *)map->elem[(ulong)key % (ulong)map->prime];
  if (list != (List *)0x0) {
    index = 0;
    do {
      __ptr = (long *)list_get(list,index);
      if (__ptr == (long *)0x0) {
        return (void *)0x0;
      }
      if ((void *)*__ptr == key) {
        list_remove(list,index);
        break;
      }
      index = index + 1;
    } while (index < list->size);
    pvVar1 = (void *)__ptr[1];
    free(__ptr);
    map->size = map->size - 1;
  }
  return pvVar1;
}

Assistant:

void *map_remove(Map *map, void *key) {
    List *els = map_get_(map, key);
    if (els == NULL)return NULL;
    Elem *elem;
    for (int i = 0; i < els->size; ++i) {
        elem = list_get(els, i);
        if (elem == NULL)return NULL;
        if (hash(elem->key) == hash(key)) {
            list_remove(els, i);
            break;
        }
    }
    void *value = elem->value;
    free(elem);
    map->size--;
    return value;
}